

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

float * __thiscall cimg_library::CImg<float>::min(CImg<float> *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  float *pfVar5;
  bool bVar6;
  CImgInstanceException *this_00;
  char *pcVar7;
  char *pcVar8;
  unsigned_long uVar9;
  float *_maxptrs;
  float *ptrs;
  float *pfStack_28;
  float min_value;
  float *ptr_min;
  CImg<float> *this_local;
  
  bVar6 = is_empty(this);
  if (!bVar6) {
    pfStack_28 = this->_data;
    ptrs._4_4_ = *pfStack_28;
    _maxptrs = this->_data;
    pfVar5 = this->_data;
    uVar9 = size(this);
    for (; _maxptrs < pfVar5 + uVar9; _maxptrs = _maxptrs + 1) {
      if (*_maxptrs < ptrs._4_4_) {
        pfStack_28 = _maxptrs;
        ptrs._4_4_ = *_maxptrs;
      }
    }
    return pfStack_28;
  }
  this_00 = (CImgInstanceException *)__cxa_allocate_exception(0x4008);
  uVar1 = this->_width;
  uVar2 = this->_height;
  uVar3 = this->_depth;
  uVar4 = this->_spectrum;
  pfVar5 = this->_data;
  pcVar7 = "non-";
  if ((this->_is_shared & 1U) != 0) {
    pcVar7 = "";
  }
  pcVar8 = pixel_type();
  CImgInstanceException::CImgInstanceException
            (this_00,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::min(): Empty instance.",
             (ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,pfVar5,pcVar7,pcVar8);
  __cxa_throw(this_00,&CImgInstanceException::typeinfo,CImgInstanceException::~CImgInstanceException
             );
}

Assistant:

const T& min() const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "min(): Empty instance.",
                                    cimg_instance);
      const T *ptr_min = _data;
      T min_value = *ptr_min;
      cimg_for(*this,ptrs,T) if (*ptrs<min_value) min_value = *(ptr_min=ptrs);
      return *ptr_min;
    }